

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

int compare(void *ind1,void *ind2)

{
  void *ind2_local;
  void *ind1_local;
  
  if (**ind1 < **ind2 || **ind1 == **ind2) {
    if (**ind2 <= **ind1) {
      ind1_local._4_4_ = 0;
    }
    else {
      ind1_local._4_4_ = 1;
    }
  }
  else {
    ind1_local._4_4_ = -1;
  }
  return ind1_local._4_4_;
}

Assistant:

int compare (const void* ind1, const void* ind2)
{
	if (*((vipair *)ind1)->a > *((vipair *)ind2)->a)
		return -1;
	else if (*((vipair *)ind1)->a < *((vipair *)ind2)->a)
		return 1;
	else
		return 0;
}